

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_MarkCheckingPeriodLeaksAsNonCheckingPeriod_Test::testBody
          (TEST_MemoryLeakDetectorTest_MarkCheckingPeriodLeaksAsNonCheckingPeriod_Test *this)

{
  MemoryLeakDetector *pMVar1;
  TestMemoryAllocator *pTVar2;
  char *pcVar3;
  char *pcVar4;
  UtestShell *pUVar5;
  size_t sVar6;
  TestTerminator *pTVar7;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar2 = defaultNewArrayAllocator();
  pcVar3 = MemoryLeakDetector::allocMemory(pMVar1,pTVar2,100,false);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar2 = defaultNewArrayAllocator();
  pcVar4 = MemoryLeakDetector::allocMemory(pMVar1,pTVar2,100,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_checking);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,2,sVar6,
             "LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_checking)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x1a6,pTVar7);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_all);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,2,sVar6,"LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x1a7,pTVar7);
  MemoryLeakDetector::markCheckingPeriodLeaksAsNonCheckingPeriod
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_checking);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,0,sVar6,
             "LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_checking)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x1a9,pTVar7);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_all);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,2,sVar6,"LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x1aa,pTVar7);
  (*PlatformSpecificFree)(pcVar3);
  (*PlatformSpecificFree)(pcVar4);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, MarkCheckingPeriodLeaksAsNonCheckingPeriod)
{
    char* mem = detector->allocMemory(defaultNewArrayAllocator(), 100);
    char* mem2 = detector->allocMemory(defaultNewArrayAllocator(), 100);
    detector->stopChecking();
    LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_checking));
    LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_all));
    detector->markCheckingPeriodLeaksAsNonCheckingPeriod();
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_checking));
    LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_all));
    PlatformSpecificFree(mem);
    PlatformSpecificFree(mem2);
}